

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_136_17_7d744f41 *
qclab::qgates::lambda_QGate2<double>
          (anon_class_136_17_7d744f41 *__return_storage_ptr__,Op op,SquareMatrix<double> *mat2,
          double *vector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int64_t iVar15;
  double *pdVar16;
  double *pdVar17;
  double *local_128;
  anon_class_136_17_7d744f41 f;
  double m44;
  double m43;
  double m42;
  double m41;
  double m34;
  double m33;
  double m32;
  double m31;
  double m24;
  double m23;
  double m22;
  double m21;
  double m14;
  double m13;
  double m12;
  double m11;
  double *vector_local;
  SquareMatrix<double> *mat2_local;
  Op op_local;
  
  iVar15 = dense::SquareMatrix<double>::size(mat2);
  if (iVar15 == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,mat2);
    pdVar16 = dense::SquareMatrix<double>::operator()(mat2,0,0);
    pdVar16 = (double *)*pdVar16;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,0,1);
    dVar1 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,0,2);
    dVar2 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,0,3);
    dVar3 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,1,0);
    dVar4 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,1,1);
    dVar5 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,1,2);
    dVar6 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,1,3);
    dVar7 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,2,0);
    dVar8 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,2,1);
    dVar9 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,2,2);
    dVar10 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,2,3);
    dVar11 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,3,0);
    dVar12 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,3,1);
    dVar13 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,3,2);
    dVar14 = *pdVar17;
    pdVar17 = dense::SquareMatrix<double>::operator()(mat2,3,3);
    f.m43 = *pdVar17;
    local_128 = vector;
    f.vector = pdVar16;
    f.m11 = dVar1;
    f.m12 = dVar2;
    f.m13 = dVar3;
    f.m14 = dVar4;
    f.m21 = dVar5;
    f.m22 = dVar6;
    f.m23 = dVar7;
    f.m24 = dVar8;
    f.m31 = dVar9;
    f.m32 = dVar10;
    f.m33 = dVar11;
    f.m34 = dVar12;
    f.m41 = dVar13;
    f.m42 = dVar14;
    f.m44 = f.m43;
    memcpy(__return_storage_ptr__,&local_128,0x88);
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = double]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }